

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void Curl_verboseconnect(connectdata *conn)

{
  uint uVar1;
  long lVar2;
  
  if (((conn->data->set).field_0x87b & 0x40) == 0) {
    return;
  }
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  lVar2 = 0x128;
  if ((((uVar1 & 0x40) == 0) && (lVar2 = 0x168, (uVar1 & 0x20) == 0)) &&
     (lVar2 = 0x108, (uVar1 & 4) == 0)) {
    lVar2 = 0xd8;
  }
  Curl_infof(conn->data,"Connected to %s (%s) port %ld (#%ld)\n",
             *(undefined8 *)((conn->chunk).hexbuffer + lVar2 + -0x20),conn->ip_addr_str,conn->port,
             conn->connection_id);
  return;
}

Assistant:

void Curl_verboseconnect(struct connectdata *conn)
{
  if(conn->data->set.verbose)
    infof(conn->data, "Connected to %s (%s) port %ld (#%ld)\n",
          conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
          conn->bits.httpproxy ? conn->http_proxy.host.dispname :
          conn->bits.conn_to_host ? conn->conn_to_host.dispname :
          conn->host.dispname,
          conn->ip_addr_str, conn->port, conn->connection_id);
}